

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O0

void initnet(nn_quant *nnq,uchar *thepic,int len,int sample,int colours)

{
  nq_pixel *paiVar1;
  int iVar2;
  int *p;
  int i;
  int colours_local;
  int sample_local;
  int len_local;
  uchar *thepic_local;
  nn_quant *nnq_local;
  
  memset(nnq->network,0,0x1400);
  nnq->thepicture = thepic;
  nnq->lengthcount = len;
  nnq->samplefac = sample;
  nnq->netsize = colours;
  for (p._0_4_ = 0; (int)p < nnq->netsize; p._0_4_ = (int)p + 1) {
    paiVar1 = nnq->network + (int)p;
    iVar2 = ((int)p << 0xc) / nnq->netsize;
    (*paiVar1)[3] = iVar2;
    (*paiVar1)[2] = iVar2;
    (*paiVar1)[1] = iVar2;
    (*paiVar1)[0] = iVar2;
    nnq->freq[(int)p] = (int)(0x10000 / (long)nnq->netsize);
    nnq->bias[(int)p] = 0;
  }
  return;
}

Assistant:

void initnet(nnq, thepic, len, sample, colours)
nn_quant *nnq;
unsigned char *thepic;
int len;
int sample;
int colours;
{
	register int i;
	register int *p;

	/* Clear out network from previous runs */
	/* thanks to Chen Bin for this fix */
	memset((void*)nnq->network, 0, sizeof(nq_pixel)*MAXNETSIZE);

	nnq->thepicture = thepic;
	nnq->lengthcount = len;
	nnq->samplefac = sample;
	nnq->netsize = colours;

	for (i=0; i < nnq->netsize; i++) {
		p = nnq->network[i];
		p[0] = p[1] = p[2] = p[3] = (i << (netbiasshift+8)) / nnq->netsize;
		nnq->freq[i] = intbias / nnq->netsize;	/* 1/netsize */
		nnq->bias[i] = 0;
	}
}